

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::Statement_const*>::emplaceRealloc<slang::ast::Statement_const*>
          (SmallVectorBase<slang::ast::Statement_const*> *this,pointer pos,Statement **args)

{
  pointer ppSVar1;
  ulong uVar2;
  pointer __dest;
  long lVar3;
  EVP_PKEY_CTX *__n;
  EVP_PKEY_CTX *ctx;
  pointer __dest_00;
  ulong capacity;
  
  if (*(long *)(this + 8) == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = *(long *)(this + 8) + 1;
  uVar2 = *(ulong *)(this + 0x10);
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar3 = *(long *)this;
  __dest = (pointer)detail::allocArray(capacity,8);
  ppSVar1 = (pointer)((long)__dest + ((long)pos - lVar3));
  *(Statement **)((long)__dest + ((long)pos - lVar3)) = *args;
  ctx = *(EVP_PKEY_CTX **)this;
  lVar3 = *(long *)(this + 8);
  if (ctx + lVar3 * 8 == (EVP_PKEY_CTX *)pos) {
    if (lVar3 == 0) goto LAB_0023a093;
    __n = (EVP_PKEY_CTX *)(lVar3 << 3);
    __dest_00 = __dest;
  }
  else {
    if (ctx != (EVP_PKEY_CTX *)pos) {
      memmove(__dest,ctx,(long)pos - (long)ctx);
      ctx = *(EVP_PKEY_CTX **)this;
      lVar3 = *(long *)(this + 8);
    }
    __n = ctx + (lVar3 * 8 - (long)pos);
    if (__n == (EVP_PKEY_CTX *)0x0) goto LAB_0023a093;
    ctx = (EVP_PKEY_CTX *)pos;
    __dest_00 = ppSVar1 + 1;
  }
  memmove(__dest_00,ctx,(size_t)__n);
LAB_0023a093:
  SmallVectorBase<const_slang::ast::Statement_*>::cleanup
            ((SmallVectorBase<const_slang::ast::Statement_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = capacity;
  *(pointer *)this = __dest;
  return ppSVar1;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}